

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroups.cpp
# Opt level: O2

optional_idx duckdb::anon_unknown_280::GetCPUCountV1(string *cgroup_path,FileSystem *fs)

{
  int iVar1;
  type pFVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  pointer *__ptr;
  double dVar3;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_4d8;
  optional_idx local_4d0;
  int64_t period;
  int64_t quota;
  string cfs_period;
  string cfs_quota;
  string local_478;
  string local_458 [32];
  string local_438;
  string local_418 [32];
  char byte_buffer [1000];
  
  ::std::__cxx11::string::string
            (local_418,"/sys/fs/cgroup/cpu%s/cpu.cfs_quota_us",(allocator *)byte_buffer);
  ::std::__cxx11::string::string((string *)&local_438,(string *)cgroup_path);
  StringUtil::Format<std::__cxx11::string>(&cfs_quota,(StringUtil *)local_418,&local_438,in_RCX);
  ::std::__cxx11::string::~string((string *)&local_438);
  ::std::__cxx11::string::~string(local_418);
  ::std::__cxx11::string::string
            (local_458,"/sys/fs/cgroup/cpu%s/cpu.cfs_period_us",(allocator *)byte_buffer);
  ::std::__cxx11::string::string((string *)&local_478,(string *)cgroup_path);
  StringUtil::Format<std::__cxx11::string>(&cfs_period,(StringUtil *)local_458,&local_478,in_RCX);
  ::std::__cxx11::string::~string((string *)&local_478);
  ::std::__cxx11::string::~string(local_458);
  iVar1 = (*fs->_vptr_FileSystem[0x12])(fs,&cfs_quota,0);
  if ((char)iVar1 != '\0') {
    iVar1 = (*fs->_vptr_FileSystem[0x12])(fs,&cfs_period,0);
    if ((char)iVar1 != '\0') {
      (*fs->_vptr_FileSystem[2])(&local_4d8,fs,&cfs_quota,1,0x100,0);
      pFVar2 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                          *)&local_4d8);
      iVar1 = (*fs->_vptr_FileSystem[5])(fs,pFVar2,byte_buffer,999);
      byte_buffer[CONCAT44(extraout_var,iVar1)] = '\0';
      iVar1 = __isoc99_sscanf(byte_buffer,"%ld",&quota);
      if (iVar1 == 1) {
        if (local_4d8._M_head_impl != (FileHandle *)0x0) {
          (*(local_4d8._M_head_impl)->_vptr_FileHandle[1])();
        }
        (*fs->_vptr_FileSystem[2])(&local_4d8,fs,&cfs_period,1,0x100,0);
        pFVar2 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
                 operator*((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                            *)&local_4d8);
        iVar1 = (*fs->_vptr_FileSystem[5])(fs,pFVar2,byte_buffer,999);
        byte_buffer[CONCAT44(extraout_var_00,iVar1)] = '\0';
        iVar1 = __isoc99_sscanf(byte_buffer,"%ld",&period);
        if (iVar1 == 1) {
          if (local_4d8._M_head_impl != (FileHandle *)0x0) {
            (*(local_4d8._M_head_impl)->_vptr_FileHandle[1])();
          }
          if (0 < period && 0 < quota) {
            dVar3 = ceil((double)quota / (double)period);
            optional_idx::optional_idx
                      (&local_4d0,
                       (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3);
            goto LAB_0032019a;
          }
          goto LAB_00320194;
        }
      }
      local_4d0.index = 0xffffffffffffffff;
      if (local_4d8._M_head_impl != (FileHandle *)0x0) {
        (*(local_4d8._M_head_impl)->_vptr_FileHandle[1])();
      }
      goto LAB_0032019a;
    }
  }
LAB_00320194:
  local_4d0.index = 0xffffffffffffffff;
LAB_0032019a:
  ::std::__cxx11::string::~string((string *)&cfs_period);
  ::std::__cxx11::string::~string((string *)&cfs_quota);
  return (optional_idx)local_4d0.index;
}

Assistant:

static optional_idx GetCPUCountV1(const string &cgroup_path, FileSystem &fs) {
	static constexpr const char *CFS_QUOTA = "/sys/fs/cgroup/cpu%s/cpu.cfs_quota_us";
	static constexpr const char *CFS_PERIOD = "/sys/fs/cgroup/cpu%s/cpu.cfs_period_us";

	auto cfs_quota = StringUtil::Format(CFS_QUOTA, cgroup_path);
	auto cfs_period = StringUtil::Format(CFS_PERIOD, cgroup_path);

	if (!fs.FileExists(cfs_quota) || !fs.FileExists(cfs_period)) {
		return optional_idx();
	}

	//! See https://docs.kernel.org/scheduler/sched-bwc.html
	//! run-time replenished within a period (in microseconds)
	int64_t quota;
	//! the length of a period (in microseconds)
	int64_t period;

	// cgroup v1
	char byte_buffer[1000];
	{
		auto handle = fs.OpenFile(cfs_quota, FileFlags::FILE_FLAGS_READ);
		int64_t read_bytes = fs.Read(*handle, (void *)byte_buffer, 999);
		byte_buffer[read_bytes] = '\0';
		if (std::sscanf(byte_buffer, "%" SCNd64 "", &quota) != 1) {
			return optional_idx();
		}
	}
	{
		auto handle = fs.OpenFile(cfs_period, FileFlags::FILE_FLAGS_READ);
		int64_t read_bytes = fs.Read(*handle, (void *)byte_buffer, 999);
		byte_buffer[read_bytes] = '\0';
		if (std::sscanf(byte_buffer, "%" SCNd64 "", &period) != 1) {
			return optional_idx();
		}
	}

	if (quota > 0 && period > 0) {
		return idx_t(std::ceil((double)quota / (double)period));
	}
	return optional_idx();
}